

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall
wasm::Module::removeDataSegments(Module *this,function<bool_(wasm::DataSegment_*)> *pred)

{
  function<bool_(wasm::DataSegment_*)> local_38;
  function<bool_(wasm::DataSegment_*)> *local_18;
  function<bool_(wasm::DataSegment_*)> *pred_local;
  Module *this_local;
  
  local_18 = pred;
  pred_local = (function<bool_(wasm::DataSegment_*)> *)this;
  std::function<bool_(wasm::DataSegment_*)>::function(&local_38,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>,std::allocator<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>>>,std::unordered_map<wasm::Name,wasm::DataSegment*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::DataSegment*>>>,wasm::DataSegment>
            (&this->dataSegments,&this->dataSegmentsMap,&local_38);
  std::function<bool_(wasm::DataSegment_*)>::~function(&local_38);
  return;
}

Assistant:

void Module::removeDataSegments(std::function<bool(DataSegment*)> pred) {
  removeModuleElements(dataSegments, dataSegmentsMap, pred);
}